

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequenceDictionary.cpp
# Opt level: O2

bool __thiscall
BamTools::SamSequenceDictionary::Contains(SamSequenceDictionary *this,SamSequence *sequence)

{
  bool bVar1;
  
  bVar1 = Contains(this,&sequence->Name);
  return bVar1;
}

Assistant:

bool SamSequenceDictionary::Contains(const SamSequence& sequence) const {
    return Contains(sequence.Name);
}